

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::write_date_time(char *buff,size_t buff_size)

{
  long lVar1;
  time_t sec_since_epoch;
  tm time_info;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  sec_since_epoch = lVar1 / 1000000000;
  localtime_r(&sec_since_epoch,(tm *)&time_info);
  snprintf(buff,buff_size,"%04d%02d%02d_%02d%02d%02d.%03lld",(ulong)(time_info.tm_year + 0x76c),
           (ulong)(time_info.tm_mon + 1),(ulong)(uint)time_info.tm_mday,
           (ulong)(uint)time_info.tm_hour,(ulong)(uint)time_info.tm_min,
           (ulong)(uint)time_info.tm_sec,(lVar1 / 1000000) % 1000);
  return;
}

Assistant:

void write_date_time(char* buff, size_t buff_size)
	{
		auto now = system_clock::now();
		long long ms_since_epoch = duration_cast<milliseconds>(now.time_since_epoch()).count();
		time_t sec_since_epoch = time_t(ms_since_epoch / 1000);
		tm time_info;
		localtime_r(&sec_since_epoch, &time_info);
		snprintf(buff, buff_size, "%04d%02d%02d_%02d%02d%02d.%03lld",
			1900 + time_info.tm_year, 1 + time_info.tm_mon, time_info.tm_mday,
			time_info.tm_hour, time_info.tm_min, time_info.tm_sec, ms_since_epoch % 1000);
	}